

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::MultiThreadedObjectTest::pushObjectsToShared
          (MultiThreadedObjectTest *this,TestThread *thread)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int pbufferNdx;
  long lVar6;
  long lVar7;
  int windowNdx;
  long lVar8;
  bool bVar9;
  
  bVar9 = thread->m_id == 0;
  lVar5 = 0x1b8;
  if (bVar9) {
    lVar5 = 0x1a0;
  }
  lVar7 = 0x170;
  if (bVar9) {
    lVar7 = 0x158;
  }
  lVar3 = 0x128;
  if (bVar9) {
    lVar3 = 0x110;
  }
  lVar4 = 0x200;
  if (bVar9) {
    lVar4 = 0x1e8;
  }
  lVar8 = 0;
  lVar6 = 0;
  while( true ) {
    lVar1 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode._vptr_TestNode + lVar5);
    lVar2 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx + lVar5);
    if ((int)((ulong)(lVar2 - lVar1) >> 3) <= lVar6) break;
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (&this->m_sharedPbuffers,(value_type *)(lVar1 + lVar8));
    lVar6 = lVar6 + 1;
    lVar8 = lVar8 + 8;
  }
  if (lVar2 != lVar1) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar5) = lVar1;
  }
  lVar5 = 0;
  lVar6 = 0;
  while( true ) {
    lVar8 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode._vptr_TestNode + lVar7);
    lVar1 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx + lVar7);
    if ((int)((ulong)(lVar1 - lVar8) >> 4) <= lVar6) break;
    std::
    vector<std::pair<eglu::NativeWindow_*,_void_*>,_std::allocator<std::pair<eglu::NativeWindow_*,_void_*>_>_>
    ::push_back(&this->m_sharedNativeWindows,(value_type *)(lVar8 + lVar5));
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 0x10;
  }
  if (lVar1 != lVar8) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar7) = lVar8;
  }
  lVar5 = 0;
  lVar7 = 0;
  while( true ) {
    lVar6 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode._vptr_TestNode + lVar3);
    lVar8 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx + lVar3);
    if ((int)((ulong)(lVar8 - lVar6) >> 4) <= lVar7) break;
    std::
    vector<std::pair<eglu::NativePixmap_*,_void_*>,_std::allocator<std::pair<eglu::NativePixmap_*,_void_*>_>_>
    ::push_back(&this->m_sharedNativePixmaps,(value_type *)(lVar6 + lVar5));
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0x10;
  }
  if (lVar8 != lVar6) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar3) = lVar6;
  }
  lVar5 = 0;
  lVar7 = 0;
  while( true ) {
    lVar3 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode._vptr_TestNode + lVar4);
    lVar6 = *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx + lVar4);
    if ((int)((ulong)(lVar6 - lVar3) >> 3) <= lVar7) break;
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              (&this->m_sharedContexts,(value_type *)(lVar3 + lVar5));
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 8;
  }
  if (lVar6 != lVar3) {
    *(long *)((long)&(this->super_MultiThreadedTest).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx + lVar4) = lVar3;
  }
  return;
}

Assistant:

void MultiThreadedObjectTest::pushObjectsToShared (TestThread& thread)
{
	vector<EGLSurface>&									pbuffers	= (thread.getId() == 0 ? m_pbuffers0 : m_pbuffers1);
	vector<pair<eglu::NativeWindow*, EGLSurface> >&		windows		= (thread.getId() == 0 ? m_nativeWindows0 : m_nativeWindows1);
	vector<pair<eglu::NativePixmap*, EGLSurface> >&		pixmaps		= (thread.getId() == 0 ? m_nativePixmaps0 : m_nativePixmaps1);
	vector<EGLContext>&									contexts	= (thread.getId() == 0 ? m_contexts0 : m_contexts1);

	for (int pbufferNdx = 0; pbufferNdx < (int)pbuffers.size(); pbufferNdx++)
		m_sharedPbuffers.push_back(pbuffers[pbufferNdx]);

	pbuffers.clear();

	for (int windowNdx = 0; windowNdx < (int)windows.size(); windowNdx++)
		m_sharedNativeWindows.push_back(windows[windowNdx]);

	windows.clear();

	for (int pixmapNdx = 0; pixmapNdx < (int)pixmaps.size(); pixmapNdx++)
		m_sharedNativePixmaps.push_back(pixmaps[pixmapNdx]);

	pixmaps.clear();

	for (int contextNdx = 0; contextNdx < (int)contexts.size(); contextNdx++)
		m_sharedContexts.push_back(contexts[contextNdx]);

	contexts.clear();
}